

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>::
linear_search_impl<long,phmap::priv::upper_bound_adapter<phmap::Less<long>>>
          (btree_node<phmap::priv::set_params<long,phmap::Less<long>,std::allocator<long>,256,false>>
           *this,long *k,int s,int e,void *comp)

{
  bool bVar1;
  key_type *a;
  upper_bound_adapter<phmap::Less<long>_> *comp_local;
  int e_local;
  int s_local;
  long *k_local;
  btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
  *this_local;
  
  comp_local._4_4_ = s;
  while( true ) {
    if (e <= comp_local._4_4_) {
      return (SearchResult<int,_false>)comp_local._4_4_;
    }
    a = btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
        ::key((btree_node<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>
               *)this,(long)comp_local._4_4_);
    bVar1 = upper_bound_adapter<phmap::Less<long>>::operator()(comp,a,k);
    if (!bVar1) break;
    comp_local._4_4_ = comp_local._4_4_ + 1;
  }
  return (SearchResult<int,_false>)comp_local._4_4_;
}

Assistant:

SearchResult<int, false> linear_search_impl(
            const K &k, int s, const int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s < e) {
                if (!comp(key(s), k)) {
                    break;
                }
                ++s;
            }
            return {s};
        }